

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetInline_Test::
TestBody(MicroStringPrevTest_AssignmentViaSetInline_Test *this)

{
  Arena *pAVar1;
  MicroString *this_00;
  ParamType *pPVar2;
  size_t sVar3;
  Arena *pAVar4;
  pointer *__ptr;
  char *pcVar5;
  AssertionResult gtest_ar;
  MicroString source;
  size_t used;
  string_view local_58;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  MicroString local_38;
  string_view local_30;
  size_t local_20;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  pAVar1 = &(this->super_MicroStringPrevTest).arena_;
  pAVar4 = (Arena *)0x0;
  if ((pPVar2->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
    pAVar4 = pAVar1;
  }
  local_38 = MicroStringPrevTest::MakeFromState(kInline,pAVar4);
  local_20 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  this_00 = &(this->super_MicroStringPrevTest).str_;
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if ((((uint)local_38.rep_ | *(uint *)&(this->super_MicroStringPrevTest).str_.rep_) & 3) == 0) {
    this_00->rep_ = local_38.rep_;
  }
  else {
    pAVar4 = (Arena *)0x0;
    if ((pPVar2->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
      pAVar4 = pAVar1;
    }
    MicroString::SetFromOtherSlow(this_00,&local_38,pAVar4,7);
  }
  local_58 = MicroString::Get(this_00);
  local_30 = MicroString::Get(&local_38);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_48,"str_.Get()","source.Get()",&local_58,&local_30);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x2cf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((long *)local_58._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_len + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  sVar3 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  local_58._M_len = sVar3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_48,"used","arena_space_used()",&local_20,&local_58._M_len);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x2d1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((long *)local_58._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_len + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetInline) {
  MicroString source = MakeFromState(kInline, arena());
  size_t used = arena_space_used();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  // No new memory should be used.
  EXPECT_EQ(used, arena_space_used());
}